

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O1

void __thiscall soplex::NameSet::NameSet(NameSet *this,int p_max,int mmax,Real fac,Real memFac)

{
  int n;
  
  DataSet<int>::DataSet(&this->set,p_max);
  this->mem = (char *)0x0;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::DataHashTable
            (&this->hashtab,NameSetNameHashFunction,(this->set).themax,0,fac);
  this->factor = fac;
  this->memFactor = memFac;
  this->memused = 0;
  n = (this->set).themax * 8 + 1;
  if (0 < mmax) {
    n = mmax;
  }
  this->memmax = n;
  spx_alloc<char*>(&this->mem,n);
  return;
}

Assistant:

NameSet::NameSet(int p_max, int mmax, Real fac, Real memFac)
   : set(p_max)
   , mem(nullptr)
   , hashtab(NameSetNameHashFunction, set.max(), 0, fac)
   , factor(fac)
   , memFactor(memFac)
{
   memused = 0;
   memmax = (mmax < 1) ? (8 * set.max() + 1) : mmax;
   spx_alloc(mem, memmax);
}